

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::run(Session *this)

{
  Config *config;
  type tVar1;
  unsigned_long *puVar2;
  exception *ex;
  int local_2a8;
  uint local_27c;
  undefined1 local_278 [8];
  Option<unsigned_long> listed;
  Runner runner;
  Session *this_local;
  
  if (((this->m_configData).showHelp & 1U) == 0) {
    Session::config(this);
    srand((this->m_configData).rngSeed);
    Runner::Runner((Runner *)listed.storage,&this->m_config);
    config = Session::config(this);
    list((Catch *)local_278,config);
    tVar1 = Option::operator_cast_to_function_pointer((Option *)local_278);
    if (tVar1 != 0) {
      puVar2 = Option<unsigned_long>::operator*((Option<unsigned_long> *)local_278);
      this_local._4_4_ = (int)*puVar2;
    }
    local_27c = (uint)(tVar1 != 0);
    Option<unsigned_long>::~Option((Option<unsigned_long> *)local_278);
    if (local_27c == 0) {
      Runner::runTests((Totals *)&ex,(Runner *)listed.storage);
      this_local._4_4_ = local_2a8;
      local_27c = 1;
    }
    Runner::~Runner((Runner *)listed.storage);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int run() {
            if( m_configData.showHelp )
                return 0;

            try
            {
                config(); // Force config to be constructed

                std::srand( m_configData.rngSeed );

                Runner runner( m_config );

                // Handle list request
                if( Option<std::size_t> listed = list( config() ) )
                    return static_cast<int>( *listed );

                return static_cast<int>( runner.runTests().assertions.failed );
            }
            catch( std::exception& ex ) {
                Catch::cerr() << ex.what() << std::endl;
                return (std::numeric_limits<int>::max)();
            }
        }